

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<kj::HttpInputStream::Request> __thiscall
kj::anon_unknown_36::HttpInputStreamImpl::readRequest(HttpInputStreamImpl *this)

{
  long lVar1;
  bool bVar2;
  byte extraout_AL;
  undefined8 *puVar3;
  Coroutine<kj::HttpInputStream::Request> *this_00;
  Promise<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
  *promise;
  Request **ppRVar4;
  Own<kj::AsyncInputStream,_std::nullptr_t> *other;
  PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
  *__return_storage_ptr__;
  HttpInputStreamImpl *this_01;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *this_02;
  Request *value;
  undefined8 in_RSI;
  void *pvVar5;
  void *in_stack_fffffffffffff980;
  undefined1 local_528 [8];
  Own<kj::AsyncInputStream,_std::nullptr_t> body;
  Fault local_510;
  undefined1 local_508 [8];
  undefined1 local_500 [8];
  Request *_kj_result;
  Request request;
  HttpInputStreamImpl *this_local;
  
  puVar3 = (undefined8 *)operator_new(0x518);
  *puVar3 = readRequest;
  puVar3[1] = readRequest;
  __return_storage_ptr__ =
       (PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
        *)(puVar3 + 0x4d);
  this_01 = (HttpInputStreamImpl *)(puVar3 + 0xa0);
  this_02 = (OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)(puVar3 + 0x9d);
  value = (Request *)(puVar3 + 0x94);
  this_00 = (Coroutine<kj::HttpInputStream::Request> *)(puVar3 + 2);
  puVar3[0xa1] = in_RSI;
  SourceLocation::SourceLocation
            ((SourceLocation *)(puVar3 + 0x9a),
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,"readRequest",0x58a);
  pvVar5 = (void *)puVar3[0x9c];
  kj::_::Coroutine<kj::HttpInputStream::Request>::Coroutine
            (this_00,*(SourceLocation *)(puVar3 + 0x9a));
  kj::_::Coroutine<kj::HttpInputStream::Request>::get_return_object
            ((Coroutine<kj::HttpInputStream::Request> *)this);
  kj::_::CoroutineBase::initial_suspend((CoroutineBase *)this_00);
  bVar2 = std::__n4861::suspend_never::await_ready((suspend_never *)((long)puVar3 + 0x515));
  if (bVar2) {
    std::__n4861::suspend_never::await_resume((suspend_never *)((long)puVar3 + 0x515));
    readRequestHeaders(this_01);
    promise = kj::_::Coroutine<kj::HttpInputStream::Request>::
              await_transform<kj::Promise<kj::OneOf<kj::HttpHeaders::Request,kj::HttpHeaders::ConnectRequest,kj::HttpHeaders::ProtocolError>>>
                        (this_00,(Promise<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
                                  *)this_01);
    co_await<kj::OneOf<kj::HttpHeaders::Request,kj::HttpHeaders::ConnectRequest,kj::HttpHeaders::ProtocolError>>
              (__return_storage_ptr__,promise);
    bVar2 = kj::_::PromiseAwaiterBase::await_ready((PromiseAwaiterBase *)__return_storage_ptr__);
    if (!bVar2) {
      *(undefined1 *)((long)puVar3 + 0x514) = 1;
      _GLOBAL__N_1::HttpInputStreamImpl::readRequest(in_stack_fffffffffffff980,pvVar5);
      if ((extraout_AL & 1) != 0) {
        return (PromiseBase)(PromiseBase)this;
      }
    }
    kj::_::
    PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
    ::await_resume((OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
                    *)(puVar3 + 0x8c),__return_storage_ptr__);
    kj::_::
    PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
    ::~PromiseAwaiter(__return_storage_ptr__);
    Promise<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
    ::~Promise((Promise<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
                *)this_01);
    OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
    ::tryGet<kj::HttpHeaders::Request>
              ((OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
                *)local_508);
    local_500 = (undefined1  [8])
                kj::_::readMaybe<kj::HttpHeaders::Request>
                          ((Maybe<kj::HttpHeaders::Request_&> *)local_508);
    if (local_500 == (undefined1  [8])0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[12]>
                (&local_510,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x58d,FAILED,"requestOrProtocolError.tryGet<HttpHeaders::Request>() != nullptr",
                 "\"bad request\"",(char (*) [12])"bad request");
      kj::_::Debug::Fault::fatal(&local_510);
    }
    ppRVar4 = mv<kj::HttpHeaders::Request*>((Request **)local_500);
    body.ptr = (AsyncInputStream *)*ppRVar4;
    request.url.content.ptr = (char *)(((Request *)body.ptr)->url).content.size_;
    _kj_result = *(Request **)body.ptr;
    request._0_8_ = (((Request *)body.ptr)->url).content.ptr;
    OneOf<kj::HttpMethod,kj::HttpConnectMethod>::OneOf<kj::HttpMethod&,int>
              ((OneOf<kj::HttpMethod,kj::HttpConnectMethod> *)this_02,(HttpMethod *)&_kj_result);
    getEntityBody((HttpInputStreamImpl *)local_528,(RequestOrResponse)puVar3[0xa1],
                  (OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)0x0,(uint)this_02,
                  (HttpHeaders *)0x0);
    lVar1 = puVar3[0xa1];
    OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::~OneOf(this_02);
    value->method = (HttpMethod)_kj_result;
    puVar3[0x95] = request._0_8_;
    puVar3[0x96] = request.url.content.ptr;
    puVar3[0x97] = lVar1 + 0x48;
    other = mv<kj::Own<kj::AsyncInputStream,decltype(nullptr)>>
                      ((Own<kj::AsyncInputStream,_std::nullptr_t> *)local_528);
    Own<kj::AsyncInputStream,_std::nullptr_t>::Own
              ((Own<kj::AsyncInputStream,_std::nullptr_t> *)(puVar3 + 0x98),other);
    kj::_::
    CoroutineMixin<kj::_::Coroutine<kj::HttpInputStream::Request>,_kj::HttpInputStream::Request>::
    return_value((CoroutineMixin<kj::_::Coroutine<kj::HttpInputStream::Request>,_kj::HttpInputStream::Request>
                  *)this_00,value);
    HttpInputStream::Request::~Request(value);
    Own<kj::AsyncInputStream,_std::nullptr_t>::~Own
              ((Own<kj::AsyncInputStream,_std::nullptr_t> *)local_528);
    OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
    ::~OneOf((OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
              *)(puVar3 + 0x8c));
    kj::_::CoroutineBase::final_suspend((CoroutineBase *)this_00);
    bVar2 = std::__n4861::suspend_always::await_ready((suspend_always *)((long)puVar3 + 0x516));
    if (bVar2) {
      std::__n4861::suspend_always::await_resume((suspend_always *)((long)puVar3 + 0x516));
      kj::_::Coroutine<kj::HttpInputStream::Request>::~Coroutine(this_00);
      if (puVar3 != (undefined8 *)0x0) {
        operator_delete(puVar3,0x518);
      }
    }
    else {
      *puVar3 = 0;
      *(undefined1 *)((long)puVar3 + 0x514) = 2;
      _GLOBAL__N_1::HttpInputStreamImpl::readRequest(in_stack_fffffffffffff980,pvVar5);
    }
  }
  else {
    *(undefined1 *)((long)puVar3 + 0x514) = 0;
    _GLOBAL__N_1::HttpInputStreamImpl::readRequest(in_stack_fffffffffffff980,pvVar5);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<Request> readRequest() override {
    auto requestOrProtocolError = co_await readRequestHeaders();
    auto request = KJ_REQUIRE_NONNULL(
        requestOrProtocolError.tryGet<HttpHeaders::Request>(), "bad request");
    auto body = getEntityBody(HttpInputStreamImpl::REQUEST, request.method, 0, headers);

    co_return { request.method, request.url, headers, kj::mv(body) };
  }